

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# padding_x86.cpp
# Opt level: O3

int __thiscall
ncnn::Padding_x86::forward(Padding_x86 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int iVar1;
  void *pvVar2;
  size_t sVar3;
  size_t sVar4;
  int iVar5;
  _func_int **pp_Var6;
  int iVar7;
  ulong uVar8;
  undefined4 *puVar9;
  Mat *pMVar10;
  undefined1 (*pauVar11) [16];
  ulong uVar12;
  uint uVar13;
  _func_int *p_Var14;
  long lVar15;
  ulong uVar16;
  Mat *pMVar17;
  uint uVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  long lVar22;
  int iVar23;
  undefined1 (*pauVar24) [16];
  ulong uVar25;
  bool bVar26;
  undefined4 uVar27;
  undefined4 uVar30;
  undefined4 uVar31;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined4 uVar32;
  uint uVar33;
  undefined8 in_XMM1_Qa;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  __m128 v;
  __m128 v_00;
  __m128 v_01;
  __m128 v_02;
  Option opt_pack1;
  Mat local_f0;
  ulong local_a8;
  Mat *local_a0;
  undefined8 local_98;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  ulong local_80;
  Option local_78;
  
  p_Var14 = this->_vptr_Padding_x86[-3];
  uVar18 = *(uint *)(&this->field_0xd0 + (long)p_Var14);
  if (((((uVar18 == 0) && (*(int *)(&this->field_0xd4 + (long)p_Var14) == 0)) &&
       (*(int *)(&this->field_0xd8 + (long)p_Var14) == 0)) &&
      ((*(int *)(&this->field_0xdc + (long)p_Var14) == 0 &&
       (*(int *)(&this->field_0xe8 + (long)p_Var14) == 0)))) &&
     (*(int *)(&this->field_0xec + (long)p_Var14) == 0)) {
    Mat::operator=(top_blob,bottom_blob);
    return 0;
  }
  local_f0.elempack = bottom_blob->elempack;
  local_f0.elemsize = bottom_blob->elemsize;
  if (local_f0.elempack == 0) {
    local_f0.w = bottom_blob->w;
    local_f0.h = bottom_blob->h;
    iVar5 = bottom_blob->d;
    uVar33 = bottom_blob->c;
    local_f0.dims = bottom_blob->dims;
  }
  else {
    if (((int)local_f0.elemsize * 8) / local_f0.elempack == 8) {
      iVar5 = forward_int8(this,bottom_blob,top_blob,opt);
      return iVar5;
    }
    local_f0.w = bottom_blob->w;
    local_f0.h = bottom_blob->h;
    iVar5 = bottom_blob->d;
    uVar33 = bottom_blob->c;
    local_f0.dims = bottom_blob->dims;
    if (local_f0.elempack == 4) {
      switch(local_f0.dims) {
      case 1:
        uVar18 = *(uint *)(&this->field_0xd8 + (long)p_Var14) + local_f0.w * 4 +
                 *(int *)(&this->field_0xdc + (long)p_Var14);
        bVar26 = (uVar18 & 3) == 0;
        local_f0.dims = 1;
        local_a0 = top_blob;
        if (((*(uint *)(&this->field_0xd8 + (long)p_Var14) & 3) == 0 && bVar26) &&
           (*(int *)(&this->field_0xe0 + (long)p_Var14) == 0)) {
          Mat::create(top_blob,(int)uVar18 >> 2,(local_f0.elemsize >> 2) << bVar26 * '\x02',4,
                      opt->blob_allocator);
          if ((Mat *)top_blob->data == (Mat *)0x0) {
            return -100;
          }
          if ((long)top_blob->c * top_blob->cstep != 0) {
            p_Var14 = this->_vptr_Padding_x86[-3];
            iVar5 = *(int *)(&this->field_0xd8 + (long)p_Var14);
            iVar7 = iVar5 + 3;
            if (-1 < iVar5) {
              iVar7 = iVar5;
            }
            v[1] = (float)*(undefined4 *)(&this->field_0xe4 + (long)p_Var14);
            v[0] = (float)*(undefined4 *)(&this->field_0xe4 + (long)p_Var14);
            iVar5 = *(int *)(&this->field_0xdc + (long)p_Var14);
            iVar20 = iVar5 + 3;
            if (-1 < iVar5) {
              iVar20 = iVar5;
            }
            v[2] = (float)(int)in_XMM1_Qa;
            v[3] = (float)(int)((ulong)in_XMM1_Qa >> 0x20);
            padding_constant_pack4_sse
                      ((ncnn *)bottom_blob,(Mat *)top_blob->data,(Mat *)(ulong)(uint)local_a0->w,0,0
                       ,iVar7 >> 2,iVar20 >> 2,v);
            return 0;
          }
          return -100;
        }
        break;
      case 2:
        auVar35._4_4_ = local_f0.h;
        auVar35._0_4_ = local_f0.h;
        auVar35._8_4_ = local_f0.h;
        auVar35._12_4_ = local_f0.h;
        uVar13 = uVar18 + local_f0.h * 4 + *(int *)(&this->field_0xd4 + (long)p_Var14);
        bVar26 = (uVar13 & 3) == 0;
        local_f0.dims = 2;
        local_a0 = top_blob;
        if (((uVar18 & 3) == 0 && bVar26) && (*(int *)(&this->field_0xe0 + (long)p_Var14) == 0)) {
          Mat::create(top_blob,local_f0.w + *(int *)(&this->field_0xd8 + (long)p_Var14) +
                               *(int *)(&this->field_0xdc + (long)p_Var14),(int)uVar13 >> 2,
                      (local_f0.elemsize >> 2) << bVar26 * '\x02',4,opt->blob_allocator);
          if ((Mat *)top_blob->data == (Mat *)0x0) {
            return -100;
          }
          if ((long)top_blob->c * top_blob->cstep != 0) {
            p_Var14 = this->_vptr_Padding_x86[-3];
            v_02[1] = (float)*(undefined4 *)(&this->field_0xe4 + (long)p_Var14);
            v_02[0] = (float)*(undefined4 *)(&this->field_0xe4 + (long)p_Var14);
            iVar5 = *(int *)(&this->field_0xd0 + (long)p_Var14);
            iVar7 = *(int *)(&this->field_0xd4 + (long)p_Var14);
            iVar20 = iVar5 + 3;
            if (-1 < iVar5) {
              iVar20 = iVar5;
            }
            iVar5 = iVar7 + 3;
            if (-1 < iVar7) {
              iVar5 = iVar7;
            }
            v_02._8_8_ = auVar35._0_8_;
            padding_constant_pack4_sse
                      ((ncnn *)bottom_blob,(Mat *)top_blob->data,(Mat *)(ulong)(uint)local_a0->w,
                       iVar20 >> 2,iVar5 >> 2,*(int *)(&this->field_0xd8 + (long)p_Var14),
                       *(int *)(&this->field_0xdc + (long)p_Var14),v_02);
            return 0;
          }
          return -100;
        }
        break;
      case 3:
        local_98 = (ulong)uVar33;
        uVar13 = *(uint *)(&this->field_0xe8 + (long)p_Var14) + uVar33 * 4 +
                 *(int *)(&this->field_0xec + (long)p_Var14);
        bVar26 = (uVar13 & 3) == 0;
        local_f0.dims = 3;
        local_a0 = top_blob;
        if ((*(uint *)(&this->field_0xe8 + (long)p_Var14) & 3) == 0 && bVar26) {
          auVar34._4_4_ = local_f0.h;
          auVar34._0_4_ = local_f0.h;
          auVar34._8_4_ = local_f0.h;
          auVar34._12_4_ = local_f0.h;
          if ((uVar13 == uVar33 * 4) || (*(int *)(&this->field_0xe0 + (long)p_Var14) == 0)) {
            uVar13 = (int)uVar13 >> 2;
            Mat::create(top_blob,local_f0.w + *(int *)(&this->field_0xd8 + (long)p_Var14) +
                                 *(int *)(&this->field_0xdc + (long)p_Var14),
                        uVar18 + local_f0.h + *(int *)(&this->field_0xd4 + (long)p_Var14),uVar13,
                        (local_f0.elemsize >> 2) << bVar26 * '\x02',4,opt->blob_allocator);
            if (top_blob->data == (void *)0x0) {
              return -100;
            }
            if ((long)top_blob->c * top_blob->cstep != 0) {
              iVar5 = *(int *)(&this->field_0xe8 + (long)this->_vptr_Padding_x86[-3]);
              iVar7 = iVar5 + 3;
              if (-1 < iVar5) {
                iVar7 = iVar5;
              }
              if ((int)uVar13 < 1) {
                return 0;
              }
              local_a8 = (ulong)uVar13;
              uVar12 = 0;
              do {
                iVar5 = 1;
                if (local_a0->dims != 3) {
                  iVar5 = local_a0->d;
                }
                pp_Var6 = this->_vptr_Padding_x86;
                p_Var14 = pp_Var6[-3];
                if (*(int *)(&this->field_0xf0 + (long)p_Var14) == 0) {
                  uVar27 = *(undefined4 *)(&this->field_0xe4 + (long)p_Var14);
                  auVar28._4_4_ = uVar27;
                  auVar28._0_4_ = uVar27;
                  auVar28._8_4_ = uVar27;
                  auVar28._12_4_ = uVar27;
                }
                else {
                  auVar28 = *(undefined1 (*) [16])
                             (*(long *)(&this->field_0xf8 + (long)p_Var14) + uVar12 * 0x10);
                }
                pvVar2 = local_a0->data;
                sVar4 = local_a0->elemsize;
                sVar3 = local_a0->cstep;
                uVar18 = (int)uVar12 - (iVar7 >> 2);
                if ((int)uVar18 < 0 || (int)local_98 <= (int)uVar18) {
                  uVar18 = iVar5 * local_a0->w * local_a0->h;
                  if (0 < (int)uVar18) {
                    lVar15 = 0;
                    do {
                      *(undefined1 (*) [16])((long)pvVar2 + lVar15 + sVar3 * sVar4 * uVar12) =
                           auVar28;
                      lVar15 = lVar15 + 0x10;
                    } while ((ulong)uVar18 << 4 != lVar15);
                  }
                }
                else {
                  bVar26 = bottom_blob->dims == 3;
                  local_f0.c = 1;
                  if (!bVar26) {
                    local_f0.c = bottom_blob->d;
                  }
                  pMVar10 = (Mat *)((long)pvVar2 + sVar3 * uVar12 * sVar4);
                  local_f0.w = bottom_blob->w;
                  iVar5 = bottom_blob->h;
                  local_f0.dims = bVar26 ^ 3;
                  local_f0.elemsize = bottom_blob->elemsize;
                  pauVar24 = (undefined1 (*) [16])
                             ((ulong)uVar18 * bottom_blob->cstep * local_f0.elemsize +
                             (long)bottom_blob->data);
                  local_f0.elempack = bottom_blob->elempack;
                  local_f0.allocator = bottom_blob->allocator;
                  local_f0.refcount = (int *)0x0;
                  local_f0.cstep = (long)iVar5 * (long)local_f0.w;
                  local_f0.d = 1;
                  iVar20 = *(int *)(&this->field_0xe0 + (long)p_Var14);
                  local_f0.data = pauVar24;
                  local_f0.h = iVar5;
                  if (iVar20 == 0) {
                    v_00._0_8_ = auVar28._0_8_;
                    v_00._8_8_ = auVar34._0_8_;
                    padding_constant_pack4_sse
                              ((ncnn *)&local_f0,pMVar10,(Mat *)(ulong)(uint)local_a0->w,
                               *(int *)(&this->field_0xd0 + (long)p_Var14),
                               *(int *)(&this->field_0xd4 + (long)p_Var14),
                               *(int *)(&this->field_0xd8 + (long)p_Var14),
                               *(int *)(&this->field_0xdc + (long)p_Var14),v_00);
                    pp_Var6 = this->_vptr_Padding_x86;
                    p_Var14 = pp_Var6[-3];
                    iVar20 = *(int *)(&this->field_0xe0 + (long)p_Var14);
                  }
                  if (iVar20 == 1) {
                    iVar20 = *(int *)(&this->field_0xd0 + (long)p_Var14);
                    iVar21 = *(int *)(&this->field_0xd4 + (long)p_Var14);
                    iVar23 = *(int *)(&this->field_0xd8 + (long)p_Var14);
                    iVar1 = *(int *)(&this->field_0xdc + (long)p_Var14);
                    pMVar17 = pMVar10;
                    if (0 < iVar20) {
                      iVar19 = 0;
                      do {
                        auVar29 = *pauVar24;
                        iVar5 = iVar23;
                        if (0 < iVar23) {
                          do {
                            pMVar17->data = (void *)auVar29._0_8_;
                            pMVar17->refcount = (int *)auVar29._8_8_;
                            pMVar17 = (Mat *)&pMVar17->elemsize;
                            iVar5 = iVar5 + -1;
                          } while (iVar5 != 0);
                        }
                        if (0 < local_f0.w) {
                          iVar5 = 0;
                          pauVar11 = pauVar24;
                          do {
                            auVar29 = *pauVar11;
                            pMVar17->data = (void *)auVar29._0_8_;
                            pMVar17->refcount = (int *)auVar29._8_8_;
                            pauVar11 = pauVar11 + 1;
                            pMVar17 = (Mat *)&pMVar17->elemsize;
                            iVar5 = iVar5 + 1;
                          } while (iVar5 < local_f0.w);
                        }
                        iVar5 = iVar1;
                        if (0 < iVar1) {
                          do {
                            pMVar17->data = (void *)auVar29._0_8_;
                            pMVar17->refcount = (int *)auVar29._8_8_;
                            pMVar17 = (Mat *)&pMVar17->elemsize;
                            iVar5 = iVar5 + -1;
                          } while (iVar5 != 0);
                        }
                        iVar19 = iVar19 + 1;
                        iVar5 = local_f0.h;
                      } while (iVar19 != iVar20);
                    }
                    if (0 < iVar5) {
                      iVar5 = 0;
                      do {
                        auVar29 = *pauVar24;
                        iVar20 = iVar23;
                        if (0 < iVar23) {
                          do {
                            pMVar17->data = (void *)auVar29._0_8_;
                            pMVar17->refcount = (int *)auVar29._8_8_;
                            pMVar17 = (Mat *)&pMVar17->elemsize;
                            iVar20 = iVar20 + -1;
                          } while (iVar20 != 0);
                        }
                        if (0 < local_f0.w) {
                          iVar20 = 0;
                          do {
                            auVar29 = *pauVar24;
                            pMVar17->data = (void *)auVar29._0_8_;
                            pMVar17->refcount = (int *)auVar29._8_8_;
                            pauVar24 = pauVar24 + 1;
                            pMVar17 = (Mat *)&pMVar17->elemsize;
                            iVar20 = iVar20 + 1;
                          } while (iVar20 < local_f0.w);
                        }
                        iVar20 = iVar1;
                        if (0 < iVar1) {
                          do {
                            pMVar17->data = (void *)auVar29._0_8_;
                            pMVar17->refcount = (int *)auVar29._8_8_;
                            pMVar17 = (Mat *)&pMVar17->elemsize;
                            iVar20 = iVar20 + -1;
                          } while (iVar20 != 0);
                        }
                        iVar5 = iVar5 + 1;
                      } while (iVar5 < local_f0.h);
                    }
                    if (0 < iVar21) {
                      iVar5 = 0;
                      do {
                        auVar29 = pauVar24[-(long)local_f0.w];
                        iVar20 = iVar23;
                        if (0 < iVar23) {
                          do {
                            pMVar17->data = (void *)auVar29._0_8_;
                            pMVar17->refcount = (int *)auVar29._8_8_;
                            pMVar17 = (Mat *)&pMVar17->elemsize;
                            iVar20 = iVar20 + -1;
                          } while (iVar20 != 0);
                        }
                        if (0 < local_f0.w) {
                          iVar20 = 0;
                          pauVar11 = pauVar24 + -(long)local_f0.w;
                          do {
                            auVar29 = *pauVar11;
                            pMVar17->data = (void *)auVar29._0_8_;
                            pMVar17->refcount = (int *)auVar29._8_8_;
                            pauVar11 = pauVar11 + 1;
                            pMVar17 = (Mat *)&pMVar17->elemsize;
                            iVar20 = iVar20 + 1;
                          } while (iVar20 < local_f0.w);
                        }
                        iVar20 = iVar1;
                        if (0 < iVar1) {
                          do {
                            pMVar17->data = (void *)auVar29._0_8_;
                            pMVar17->refcount = (int *)auVar29._8_8_;
                            pMVar17 = (Mat *)&pMVar17->elemsize;
                            iVar20 = iVar20 + -1;
                          } while (iVar20 != 0);
                        }
                        iVar5 = iVar5 + 1;
                      } while (iVar5 != iVar21);
                    }
                  }
                  p_Var14 = pp_Var6[-3];
                  if (*(int *)(&this->field_0xe0 + (long)p_Var14) == 2) {
                    iVar5 = *(int *)(&this->field_0xd0 + (long)p_Var14);
                    iVar20 = *(int *)(&this->field_0xd4 + (long)p_Var14);
                    uVar18 = *(uint *)(&this->field_0xd8 + (long)p_Var14);
                    uVar8 = (ulong)uVar18;
                    uVar33 = *(uint *)(&this->field_0xdc + (long)p_Var14);
                    uVar25 = (ulong)uVar33;
                    pauVar24 = (undefined1 (*) [16])
                               ((undefined1 *)local_f0.data + (long)(iVar5 * local_f0.w * 4) * 4);
                    if (0 < iVar5) {
                      iVar21 = 0;
                      do {
                        lVar15 = uVar8 << 4;
                        if (0 < (int)uVar18) {
                          do {
                            *(undefined1 (*) [16])pMVar10 =
                                 *(undefined1 (*) [16])(*pauVar24 + lVar15);
                            pMVar10 = (Mat *)&pMVar10->elemsize;
                            lVar15 = lVar15 + -0x10;
                          } while (lVar15 != 0);
                        }
                        pauVar11 = pauVar24;
                        if (0 < local_f0.w) {
                          iVar23 = 0;
                          do {
                            *(undefined1 (*) [16])pMVar10 = *pauVar11;
                            pauVar11 = pauVar11 + 1;
                            pMVar10 = (Mat *)&pMVar10->elemsize;
                            iVar23 = iVar23 + 1;
                          } while (iVar23 < local_f0.w);
                        }
                        if (0 < (int)uVar33) {
                          lVar15 = -0x20;
                          do {
                            *(undefined1 (*) [16])pMVar10 =
                                 *(undefined1 (*) [16])(*pauVar11 + lVar15);
                            pMVar10 = (Mat *)&pMVar10->elemsize;
                            lVar22 = uVar25 * 0x10 + lVar15;
                            lVar15 = lVar15 + -0x10;
                          } while (lVar22 != -0x10);
                        }
                        pauVar24 = (undefined1 (*) [16])
                                   ((long)pauVar24 + (long)(local_f0.w * 4) * -4);
                        iVar21 = iVar21 + 1;
                      } while (iVar21 != iVar5);
                    }
                    if (0 < local_f0.h) {
                      iVar5 = 0;
                      do {
                        lVar15 = uVar8 << 4;
                        if (0 < (int)uVar18) {
                          do {
                            *(undefined1 (*) [16])pMVar10 =
                                 *(undefined1 (*) [16])(*pauVar24 + lVar15);
                            pMVar10 = (Mat *)&pMVar10->elemsize;
                            lVar15 = lVar15 + -0x10;
                          } while (lVar15 != 0);
                        }
                        if (0 < local_f0.w) {
                          iVar21 = 0;
                          do {
                            *(undefined1 (*) [16])pMVar10 = *pauVar24;
                            pauVar24 = pauVar24 + 1;
                            pMVar10 = (Mat *)&pMVar10->elemsize;
                            iVar21 = iVar21 + 1;
                          } while (iVar21 < local_f0.w);
                        }
                        if (0 < (int)uVar33) {
                          lVar15 = -0x20;
                          do {
                            *(undefined1 (*) [16])pMVar10 =
                                 *(undefined1 (*) [16])(*pauVar24 + lVar15);
                            pMVar10 = (Mat *)&pMVar10->elemsize;
                            lVar22 = uVar25 * 0x10 + lVar15;
                            lVar15 = lVar15 + -0x10;
                          } while (lVar22 != -0x10);
                        }
                        iVar5 = iVar5 + 1;
                      } while (iVar5 < local_f0.h);
                    }
                    if (0 < iVar20) {
                      uVar16 = (ulong)local_f0.w;
                      pauVar24 = pauVar24 + uVar16 * -2;
                      iVar5 = 0;
                      do {
                        lVar15 = uVar8 << 4;
                        if (0 < (int)uVar18) {
                          do {
                            *(undefined1 (*) [16])pMVar10 =
                                 *(undefined1 (*) [16])(*pauVar24 + lVar15);
                            pMVar10 = (Mat *)&pMVar10->elemsize;
                            lVar15 = lVar15 + -0x10;
                          } while (lVar15 != 0);
                          uVar16 = (ulong)(uint)local_f0.w;
                        }
                        pauVar11 = pauVar24;
                        if (0 < (int)uVar16) {
                          iVar21 = 0;
                          do {
                            *(undefined1 (*) [16])pMVar10 = *pauVar11;
                            pauVar11 = pauVar11 + 1;
                            pMVar10 = (Mat *)&pMVar10->elemsize;
                            iVar21 = iVar21 + 1;
                            uVar16 = (ulong)(uint)local_f0.w;
                          } while (iVar21 < local_f0.w);
                        }
                        if (0 < (int)uVar33) {
                          lVar15 = -0x20;
                          do {
                            *(undefined1 (*) [16])pMVar10 =
                                 *(undefined1 (*) [16])(*pauVar11 + lVar15);
                            pMVar10 = (Mat *)&pMVar10->elemsize;
                            lVar22 = uVar25 * 0x10 + lVar15;
                            lVar15 = lVar15 + -0x10;
                          } while (lVar22 != -0x10);
                          uVar16 = (ulong)(uint)local_f0.w;
                        }
                        pauVar24 = (undefined1 (*) [16])
                                   ((long)pauVar24 + (long)((int)uVar16 * 4) * -4);
                        iVar5 = iVar5 + 1;
                      } while (iVar5 != iVar20);
                    }
                  }
                  if (local_f0.refcount != (int *)0x0) {
                    LOCK();
                    *local_f0.refcount = *local_f0.refcount + -1;
                    UNLOCK();
                    if (*local_f0.refcount == 0) {
                      if (local_f0.allocator == (Allocator *)0x0) {
                        if ((undefined1 (*) [16])local_f0.data != (undefined1 (*) [16])0x0) {
                          free(local_f0.data);
                        }
                      }
                      else {
                        (*(local_f0.allocator)->_vptr_Allocator[3])();
                      }
                    }
                  }
                }
                uVar12 = uVar12 + 1;
              } while (uVar12 != local_a8);
              return 0;
            }
            return -100;
          }
        }
        break;
      case 4:
        local_f0.dims = 4;
        local_a0 = top_blob;
        if (*(int *)(&this->field_0xe0 + (long)p_Var14) == 0) {
          iVar7 = *(int *)(&this->field_0xe8 + (long)p_Var14) + iVar5 +
                  *(int *)(&this->field_0xec + (long)p_Var14);
          auVar29._4_4_ = local_f0.h;
          auVar29._0_4_ = local_f0.h;
          auVar29._8_4_ = local_f0.h;
          auVar29._12_4_ = local_f0.h;
          local_a8 = CONCAT44(local_a8._4_4_,iVar7);
          Mat::create(top_blob,local_f0.w + *(int *)(&this->field_0xd8 + (long)p_Var14) +
                               *(int *)(&this->field_0xdc + (long)p_Var14),
                      uVar18 + local_f0.h + *(int *)(&this->field_0xd4 + (long)p_Var14),iVar7,uVar33
                      ,local_f0.elemsize,4,opt->blob_allocator);
          if (top_blob->data == (void *)0x0) {
            return -100;
          }
          if ((long)top_blob->c * top_blob->cstep != 0) {
            if ((int)uVar33 < 1) {
              return 0;
            }
            local_80 = (ulong)uVar33;
            uVar8 = local_a8 & 0xffffffff;
            uVar12 = 0;
            do {
              p_Var14 = this->_vptr_Padding_x86[-3];
              if (*(int *)(&this->field_0xf0 + (long)p_Var14) == 0) {
                uVar27 = *(undefined4 *)(&this->field_0xe4 + (long)p_Var14);
                uVar30 = uVar27;
                uVar31 = uVar27;
                uVar32 = uVar27;
              }
              else {
                puVar9 = (undefined4 *)
                         (*(long *)(&this->field_0xf8 + (long)p_Var14) + uVar12 * 0x10);
                uVar27 = *puVar9;
                uVar30 = puVar9[1];
                uVar31 = puVar9[2];
                uVar32 = puVar9[3];
              }
              if (0 < (int)local_a8) {
                uVar25 = 0;
                local_98 = CONCAT44(uVar30,uVar27);
                uStack_90 = uVar31;
                uStack_8c = uVar32;
                do {
                  pMVar10 = (Mat *)(long)local_a0->w;
                  sVar4 = local_a0->elemsize;
                  lVar22 = local_a0->cstep * uVar12;
                  lVar15 = (long)local_a0->h * (long)pMVar10;
                  p_Var14 = this->_vptr_Padding_x86[-3];
                  uVar18 = (int)uVar25 - *(int *)(&this->field_0xe8 + (long)p_Var14);
                  if ((int)uVar18 < 0 || iVar5 <= (int)uVar18) {
                    uVar18 = (uint)lVar15;
                    if (0 < (int)uVar18) {
                      uVar16 = (ulong)(uVar18 & 0x7fffffff);
                      puVar9 = (undefined4 *)
                               ((long)local_a0->data +
                               sVar4 * ((long)local_a0->h * uVar25 * (long)pMVar10 + lVar22));
                      do {
                        *puVar9 = uVar27;
                        puVar9[1] = uVar30;
                        puVar9[2] = uVar31;
                        puVar9[3] = uVar32;
                        puVar9 = puVar9 + 4;
                        uVar16 = uVar16 - 1;
                      } while (uVar16 != 0);
                    }
                  }
                  else {
                    local_f0.w = bottom_blob->w;
                    local_f0.elemsize = bottom_blob->elemsize;
                    local_f0.h = bottom_blob->h;
                    local_f0.cstep = (long)local_f0.h * (long)local_f0.w;
                    local_f0.elempack = bottom_blob->elempack;
                    local_f0.data =
                         (void *)((long)bottom_blob->data +
                                 local_f0.elemsize * local_f0.cstep * (ulong)uVar18 +
                                 bottom_blob->cstep * uVar12 * local_f0.elemsize);
                    local_f0.allocator = bottom_blob->allocator;
                    local_f0.refcount = (int *)0x0;
                    local_f0.dims = 2;
                    local_f0.d = 1;
                    local_f0.c = 1;
                    v_01._8_8_ = auVar29._0_8_;
                    v_01[0] = (float)(int)local_98;
                    v_01[1] = (float)local_98._4_4_;
                    padding_constant_pack4_sse
                              ((ncnn *)&local_f0,
                               (Mat *)((long)local_a0->data +
                                      lVar15 * sVar4 * uVar25 + lVar22 * sVar4),pMVar10,
                               *(int *)(&this->field_0xd0 + (long)p_Var14),
                               *(int *)(&this->field_0xd4 + (long)p_Var14),
                               *(int *)(&this->field_0xd8 + (long)p_Var14),
                               *(int *)(&this->field_0xdc + (long)p_Var14),v_01);
                    uVar27 = (int)local_98;
                    uVar30 = local_98._4_4_;
                    uVar31 = uStack_90;
                    uVar32 = uStack_8c;
                  }
                  uVar25 = uVar25 + 1;
                } while (uVar25 != uVar8);
              }
              uVar12 = uVar12 + 1;
            } while (uVar12 != local_80);
            return 0;
          }
          return -100;
        }
      }
    }
  }
  local_f0.data = bottom_blob->data;
  local_f0.refcount = bottom_blob->refcount;
  local_f0.allocator = bottom_blob->allocator;
  local_f0.c = uVar33;
  local_f0.d = iVar5;
  local_f0.cstep = bottom_blob->cstep;
  if (local_f0.refcount != (int *)0x0) {
    LOCK();
    *local_f0.refcount = *local_f0.refcount + 1;
    UNLOCK();
  }
  if (local_f0.elempack != 1) {
    local_78.lightmode = opt->lightmode;
    local_78._1_3_ = *(undefined3 *)&opt->field_0x1;
    local_78.num_threads = opt->num_threads;
    local_78.workspace_allocator = opt->workspace_allocator;
    local_78.openmp_blocktime = opt->openmp_blocktime;
    local_78.use_winograd_convolution = opt->use_winograd_convolution;
    local_78.use_sgemm_convolution = opt->use_sgemm_convolution;
    local_78.use_int8_inference = opt->use_int8_inference;
    local_78.use_vulkan_compute = opt->use_vulkan_compute;
    local_78.use_bf16_storage = opt->use_bf16_storage;
    local_78.use_fp16_packed = opt->use_fp16_packed;
    local_78.use_fp16_storage = opt->use_fp16_storage;
    local_78.use_fp16_arithmetic = opt->use_fp16_arithmetic;
    local_78.use_int8_packed = opt->use_int8_packed;
    local_78.use_int8_storage = opt->use_int8_storage;
    local_78.use_int8_arithmetic = opt->use_int8_arithmetic;
    local_78.use_packing_layout = opt->use_packing_layout;
    local_78.use_shader_pack8 = opt->use_shader_pack8;
    local_78.use_subgroup_basic = opt->use_subgroup_basic;
    local_78.use_subgroup_vote = opt->use_subgroup_vote;
    local_78.use_subgroup_ballot = opt->use_subgroup_ballot;
    local_78.use_subgroup_shuffle = opt->use_subgroup_shuffle;
    local_78.use_image_storage = opt->use_image_storage;
    local_78.use_tensor_storage = opt->use_tensor_storage;
    local_78.use_weight_fp16_storage = opt->use_weight_fp16_storage;
    local_78.flush_denormals = opt->flush_denormals;
    local_78.use_local_pool_allocator = opt->use_local_pool_allocator;
    local_78.use_reserved_1 = opt->use_reserved_1;
    local_78.use_reserved_2 = opt->use_reserved_2;
    local_78.use_reserved_3 = opt->use_reserved_3;
    local_78.use_reserved_4 = opt->use_reserved_4;
    local_78.use_reserved_5 = opt->use_reserved_5;
    local_78.use_reserved_6 = opt->use_reserved_6;
    local_78.use_reserved_7 = opt->use_reserved_7;
    local_78.use_reserved_8 = opt->use_reserved_8;
    local_78.use_reserved_9 = opt->use_reserved_9;
    local_78.use_reserved_10 = opt->use_reserved_10;
    local_78.use_reserved_11 = opt->use_reserved_11;
    local_78.blob_allocator = opt->workspace_allocator;
    convert_packing(bottom_blob,&local_f0,1,&local_78);
  }
  iVar5 = Padding::forward((Padding *)
                           ((long)&this->_vptr_Padding_x86 + (long)this->_vptr_Padding_x86[-3]),
                           &local_f0,top_blob,opt);
  if (local_f0.refcount != (int *)0x0) {
    LOCK();
    *local_f0.refcount = *local_f0.refcount + -1;
    UNLOCK();
    if (*local_f0.refcount == 0) {
      if (local_f0.allocator == (Allocator *)0x0) {
        if (local_f0.data != (void *)0x0) {
          free(local_f0.data);
        }
      }
      else {
        (*(local_f0.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar5;
}

Assistant:

int Padding_x86::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    if (top == 0 && bottom == 0 && left == 0 && right == 0 && front == 0 && behind == 0)
    {
        top_blob = bottom_blob;
        return 0;
    }

    int elembits = bottom_blob.elembits();

    if (elembits == 8)
        return forward_int8(bottom_blob, top_blob, opt);

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

#if __SSE2__
#if __AVX__
    if (elempack == 8)
    {
        if (dims == 1)
        {
            int outw = w * elempack + left + right;

            int out_elempack = outw % 8 == 0 ? 8 : outw % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (left % 8 == 0 && out_elempack == 8 && type == 0)
            {
                top_blob.create(outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                __m256 pad_value = _mm256_set1_ps(value);
                padding_constant_pack8_avx(bottom_blob, top_blob, 0, 0, left / 8, right / 8, pad_value);

                return 0;
            }
        }

        if (dims == 2)
        {
            int outw = w + left + right;
            int outh = h * elempack + top + bottom;

            int out_elempack = outh % 8 == 0 ? 8 : outh % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (top % 8 == 0 && out_elempack == 8 && type == 0)
            {
                top_blob.create(outw, outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                __m256 pad_value = _mm256_set1_ps(value);
                padding_constant_pack8_avx(bottom_blob, top_blob, top / 8, bottom / 8, left, right, pad_value);

                return 0;
            }
        }

        if (dims == 3)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outc = channels * elempack + front + behind;

            int out_elempack = outc % 8 == 0 ? 8 : outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (front % 8 == 0 && out_elempack == 8 && !(outc != channels * elempack && type != 0))
            {
                top_blob.create(outw, outh, outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                int front_ = front / elempack;
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < outc / out_elempack; q++)
                {
                    Mat borderm = top_blob.channel(q);

                    __m256 pad_value = per_channel_pad_data_size ? _mm256_loadu_ps((const float*)per_channel_pad_data + q * 8) : _mm256_set1_ps(value);
                    //Channel padding
                    if ((q - front_) < 0 || (q - front_) >= channels)
                    {
                        borderm.fill(pad_value);
                    }
                    else
                    {
                        const Mat m = bottom_blob.channel(q - front_);
                        if (type == 0)
                            padding_constant_pack8_avx(m, borderm, top, bottom, left, right, pad_value);
                        if (type == 1)
                            padding_replicate_pack8_avx(m, borderm, top, bottom, left, right);
                        if (type == 2)
                            padding_reflect_pack8_avx(m, borderm, top, bottom, left, right);
                    }
                }

                return 0;
            }
        }

        if (dims == 4)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outd = d + front + behind;

            if (type == 0)
            {
                top_blob.create(outw, outh, outd, channels, elemsize, elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    __m256 pad_value = per_channel_pad_data_size ? _mm256_loadu_ps((const float*)per_channel_pad_data + q * 8) : _mm256_set1_ps(value);

                    for (int z = 0; z < outd; z++)
                    {
                        Mat borderm = top_blob.channel(q).depth(z);

                        // depth padding
                        if ((z - front) < 0 || (z - front) >= d)
                        {
                            borderm.fill(pad_value);
                        }
                        else
                        {
                            const Mat m = bottom_blob.channel(q).depth(z - front);
                            padding_constant_pack8_avx(m, borderm, top, bottom, left, right, pad_value);
                        }
                    }
                }

                return 0;
            }
        }
    }
#endif // __AVX__

    if (elempack == 4)
    {
        if (dims == 1)
        {
            int outw = w * elempack + left + right;

#if __AVX__
            int out_elempack = outw % 8 == 0 ? 8 : outw % 4 == 0 ? 4 : 1;
#else
            int out_elempack = outw % 4 == 0 ? 4 : 1;
#endif
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (left % 4 == 0 && out_elempack == 4 && type == 0)
            {
                top_blob.create(outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                __m128 pad_value = _mm_set1_ps(value);
                padding_constant_pack4_sse(bottom_blob, top_blob, 0, 0, left / 4, right / 4, pad_value);

                return 0;
            }
        }

        if (dims == 2)
        {
            int outw = w + left + right;
            int outh = h * elempack + top + bottom;

#if __AVX__
            int out_elempack = outh % 8 == 0 ? 8 : outh % 4 == 0 ? 4 : 1;
#else
            int out_elempack = outh % 4 == 0 ? 4 : 1;
#endif
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (top % 4 == 0 && out_elempack == 4 && type == 0)
            {
                top_blob.create(outw, outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                __m128 pad_value = _mm_set1_ps(value);
                padding_constant_pack4_sse(bottom_blob, top_blob, top / 4, bottom / 4, left, right, pad_value);

                return 0;
            }
        }

        if (dims == 3)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outc = channels * elempack + front + behind;

#if __AVX__
            int out_elempack = outc % 8 == 0 ? 8 : outc % 4 == 0 ? 4 : 1;
#else
            int out_elempack = outc % 4 == 0 ? 4 : 1;
#endif
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (front % 4 == 0 && out_elempack == 4 && !(outc != channels * elempack && type != 0))
            {
                top_blob.create(outw, outh, outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                int front_ = front / elempack;
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < outc / out_elempack; q++)
                {
                    Mat borderm = top_blob.channel(q);

                    __m128 pad_value = per_channel_pad_data_size ? _mm_loadu_ps((const float*)per_channel_pad_data + q * 4) : _mm_set1_ps(value);
                    //Channel padding
                    if ((q - front_) < 0 || (q - front_) >= channels)
                    {
                        borderm.fill(pad_value);
                    }
                    else
                    {
                        const Mat m = bottom_blob.channel(q - front_);
                        if (type == 0)
                            padding_constant_pack4_sse(m, borderm, top, bottom, left, right, pad_value);
                        if (type == 1)
                            padding_replicate_pack4_sse(m, borderm, top, bottom, left, right);
                        if (type == 2)
                            padding_reflect_pack4_sse(m, borderm, top, bottom, left, right);
                    }
                }

                return 0;
            }
        }

        if (dims == 4)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outd = d + front + behind;

            if (type == 0)
            {
                top_blob.create(outw, outh, outd, channels, elemsize, elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    __m128 pad_value = per_channel_pad_data_size ? _mm_loadu_ps((const float*)per_channel_pad_data + q * 4) : _mm_set1_ps(value);

                    for (int z = 0; z < outd; z++)
                    {
                        Mat borderm = top_blob.channel(q).depth(z);

                        // depth padding
                        if ((z - front) < 0 || (z - front) >= d)
                        {
                            borderm.fill(pad_value);
                        }
                        else
                        {
                            const Mat m = bottom_blob.channel(q).depth(z - front);
                            padding_constant_pack4_sse(m, borderm, top, bottom, left, right, pad_value);
                        }
                    }
                }

                return 0;
            }
        }
    }
#endif // __SSE2__

    Mat bottom_blob_unpacked = bottom_blob;
    if (elempack != 1)
    {
        Option opt_pack1 = opt;
        opt_pack1.blob_allocator = opt.workspace_allocator;

        convert_packing(bottom_blob, bottom_blob_unpacked, 1, opt_pack1);
    }

    return Padding::forward(bottom_blob_unpacked, top_blob, opt);
}